

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

void __thiscall libtorrent::aux::http_parser::reset(http_parser *this)

{
  pointer ppVar1;
  
  (this->m_method)._M_string_length = 0;
  *(this->m_method)._M_dataplus._M_p = '\0';
  this->m_recv_pos = 0;
  this->m_body_start_pos = 0;
  this->m_state = read_status;
  this->m_status_code = -1;
  *(undefined4 *)&this->m_content_length = 0xffffffff;
  *(undefined4 *)((long)&this->m_content_length + 4) = 0xffffffff;
  *(undefined4 *)&this->m_range_start = 0xffffffff;
  *(undefined4 *)((long)&this->m_range_start + 4) = 0xffffffff;
  this->m_range_end = -1;
  this->m_finished = false;
  (this->m_recv_buffer).m_ptr = (char *)0x0;
  (this->m_recv_buffer).m_len = 0;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_header)._M_t);
  this->m_chunked_encoding = false;
  ppVar1 = (this->m_chunked_ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_chunked_ranges).
      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar1) {
    (this->m_chunked_ranges).
    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar1;
  }
  this->m_cur_chunk_end = -1;
  this->m_chunk_header_size = 0;
  this->m_partial_chunk_header = 0;
  return;
}

Assistant:

void http_parser::reset()
	{
		m_method.clear();
		m_recv_pos = 0;
		m_body_start_pos = 0;
		m_status_code = -1;
		m_content_length = -1;
		m_range_start = -1;
		m_range_end = -1;
		m_finished = false;
		m_state = read_status;
		m_recv_buffer = span<char const>();
		m_header.clear();
		m_chunked_encoding = false;
		m_chunked_ranges.clear();
		m_cur_chunk_end = -1;
		m_chunk_header_size = 0;
		m_partial_chunk_header = 0;
	}